

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

ZhouParameters * __thiscall OpenMD::EAMAdapter::getZhouParam(EAMAdapter *this)

{
  bool bVar1;
  undefined8 uVar2;
  element_type *this_00;
  ZhouParameters *in_RDI;
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> zhouData;
  shared_ptr<OpenMD::GenericData> data;
  AtomType *in_stack_ffffffffffffff18;
  shared_ptr<OpenMD::GenericData> *in_stack_ffffffffffffff20;
  string *in_stack_ffffffffffffff30;
  errorStruct *peVar3;
  AtomType *in_stack_ffffffffffffff38;
  ZhouParameters *this_01;
  string local_a0 [64];
  undefined1 local_60 [96];
  
  this_01 = in_RDI;
  bVar1 = isEAM((EAMAdapter *)0x2fc8e6);
  if (!bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam was passed an atomType (%s)\n\tthat does not appear to be an EAM atom.\n"
             ,uVar2);
    std::__cxx11::string::~string((string *)(local_60 + 0x30));
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  AtomType::getPropertyByName(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30);
  bVar1 = std::operator==(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    in_stack_ffffffffffffff38 = (AtomType *)local_60;
    uVar2 = std::__cxx11::string::c_str();
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam could not find Zhou\n\tparameters for atomType %s.\n",uVar2);
    std::__cxx11::string::~string((string *)in_stack_ffffffffffffff38);
    painCave.severity = 1;
    painCave.isFatal = 1;
    simError();
  }
  std::dynamic_pointer_cast<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,OpenMD::GenericData>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_ffffffffffffff38);
  bVar1 = std::operator==((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)
                          in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  if (bVar1) {
    AtomType::getName_abi_cxx11_(in_stack_ffffffffffffff18);
    uVar2 = std::__cxx11::string::c_str();
    peVar3 = &painCave;
    snprintf(painCave.errMsg,2000,
             "EAMAdapter::getZhouParam could not convert\n\tGenericData to ZhouData for atom type %s\n"
             ,uVar2);
    std::__cxx11::string::~string(local_a0);
    peVar3->severity = 1;
    peVar3->isFatal = 1;
    simError();
  }
  this_00 = std::
            __shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x2fcae1);
  SimpleTypeData<OpenMD::ZhouParameters>::getData(this_00);
  ZhouParameters::ZhouParameters(this_01,in_RDI);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)0x2fcb0b);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x2fcb18);
  return this_01;
}

Assistant:

ZhouParameters EAMAdapter::getZhouParam() {
    if (!isEAM()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam was passed an atomType (%s)\n"
               "\tthat does not appear to be an EAM atom.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<GenericData> data = at_->getPropertyByName(ZhouTypeID);
    if (data == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam could not find Zhou\n"
               "\tparameters for atomType %s.\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    std::shared_ptr<ZhouData> zhouData =
        std::dynamic_pointer_cast<ZhouData>(data);
    if (zhouData == nullptr) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "EAMAdapter::getZhouParam could not convert\n"
               "\tGenericData to ZhouData for atom type %s\n",
               at_->getName().c_str());
      painCave.severity = OPENMD_ERROR;
      painCave.isFatal  = 1;
      simError();
    }

    return zhouData->getData();
  }